

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.h
# Opt level: O0

bool InliningDecider::IsInlineeLeaf(FunctionBody *inlinee)

{
  bool bVar1;
  ProfileId PVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  DynamicProfileInfo *this;
  byte local_11;
  FunctionBody *inlinee_local;
  
  bVar1 = Js::FunctionBody::HasDynamicProfileInfo(inlinee);
  local_11 = 0;
  if (bVar1) {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,InlineBuiltInCallerPhase,sourceContextId,functionId);
    if (bVar1) {
      PVar2 = Js::FunctionBody::GetProfiledCallSiteCount(inlinee);
      local_11 = 0;
      if (PVar2 != 0) goto LAB_00730bdc;
    }
    else {
      bVar1 = Js::FunctionBody::HasNonBuiltInCallee(inlinee);
      local_11 = 0;
      if (bVar1) goto LAB_00730bdc;
    }
    this = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee);
    bVar1 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this);
    local_11 = bVar1 ^ 0xff;
  }
LAB_00730bdc:
  return (bool)(local_11 & 1);
}

Assistant:

static bool IsInlineeLeaf(Js::FunctionBody * const inlinee)
    {
        return inlinee->HasDynamicProfileInfo()
            && (!PHASE_OFF(Js::InlineBuiltInCallerPhase, inlinee) ? !inlinee->HasNonBuiltInCallee() : inlinee->GetProfiledCallSiteCount() == 0)
            && !inlinee->GetAnyDynamicProfileInfo()->HasLdFldCallSiteInfo();
    }